

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void FilterLoop26_C(uint8_t *p,int hstride,int vstride,int size,int thresh,int ithresh,
                   int hev_thresh)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  ulong uVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int p0;
  ulong uVar15;
  
  if (0 < size) {
    lVar9 = (long)hstride;
    lVar14 = -lVar9;
    iVar6 = size + 1;
    do {
      uVar12 = (ulong)p[lVar9 * -2];
      uVar15 = (ulong)p[lVar14];
      bVar1 = *p;
      uVar8 = (ulong)bVar1;
      uVar4 = (ulong)p[lVar9];
      if (((((int)((uint)abs0[(uVar12 - uVar4) + 0xff] + (uint)abs0[(uVar15 - uVar8) + 0xff] * 4) <=
             thresh * 2 + 1) &&
           (uVar13 = (ulong)p[lVar9 * -3],
           (int)(uint)abs0[(p[hstride * -4] - uVar13) + 0xff] <= ithresh)) &&
          ((int)(uint)abs0[(uVar13 - uVar12) + 0xff] <= ithresh)) &&
         ((int)(uint)abs0[(uVar12 - uVar15) + 0xff] <= ithresh)) {
        bVar2 = p[hstride * 2];
        if ((((int)(uint)abs0[((ulong)p[lVar9 * 3] - (ulong)bVar2) + 0xff] <= ithresh) &&
            ((int)(uint)abs0[(bVar2 - uVar4) + 0xff] <= ithresh)) &&
           ((int)(uint)abs0[(uVar4 - uVar8) + 0xff] <= ithresh)) {
          if (hev_thresh < (int)(uint)abs0[(uVar12 - uVar15) + 0xff]) {
LAB_0010a14c:
            iVar7 = ((uint)bVar1 - (uint)p[lVar14]) * 3;
            uVar3 = sclip2[(long)((char)sclip1[(uVar12 - uVar4) + 0x3fc] + iVar7 + 4 >> 3) + 0x70];
            p[lVar14] = ""[(long)(char)sclip2[(long)((char)sclip1[(uVar12 - uVar4) + 0x3fc] + iVar7
                                                     + 3 >> 3) + 0x70] + uVar15 + 0xff];
            iVar7 = (uint)bVar1 - (int)(char)uVar3;
            pbVar5 = p;
          }
          else {
            if (hev_thresh < (int)(uint)abs0[(p[lVar9] - uVar8) + 0xff]) goto LAB_0010a14c;
            iVar7 = (int)(char)sclip1[(long)(char)sclip1[(uVar12 - uVar4) + 0x3fc] +
                                      (uVar8 - uVar15) * 3 + 0x3fc];
            lVar11 = (long)(iVar7 * 0x1b + 0x3f >> 7);
            lVar10 = (long)(iVar7 * 0x12 + 0x3f >> 7);
            iVar7 = iVar7 * 9 + 0x3f >> 7;
            p[lVar9 * -3] = ""[uVar13 + (long)iVar7 + 0xff];
            p[lVar9 * -2] = ""[lVar10 + uVar12 + 0xff];
            p[lVar14] = ""[uVar15 + lVar11 + 0xff];
            *p = ""[(uVar8 - lVar11) + 0xff];
            p[lVar9] = ""[(uVar4 - lVar10) + 0xff];
            iVar7 = (uint)bVar2 - iVar7;
            pbVar5 = p + hstride * 2;
          }
          *pbVar5 = ""[(long)iVar7 + 0xff];
        }
      }
      p = p + vstride;
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  return;
}

Assistant:

static WEBP_INLINE void FilterLoop26_C(uint8_t* p,
                                       int hstride, int vstride, int size,
                                       int thresh, int ithresh,
                                       int hev_thresh) {
  const int thresh2 = 2 * thresh + 1;
  while (size-- > 0) {
    if (NeedsFilter2_C(p, hstride, thresh2, ithresh)) {
      if (Hev(p, hstride, hev_thresh)) {
        DoFilter2_C(p, hstride);
      } else {
        DoFilter6_C(p, hstride);
      }
    }
    p += vstride;
  }
}